

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

vec4 dja::lerp(float_t u,vec4 *a,vec4 *b)

{
  vec4 vVar1;
  vec4 local_50;
  vec4 local_40;
  vec4 *local_30;
  vec4 *b_local;
  vec4 *a_local;
  float_t u_local;
  
  local_30 = b;
  b_local = a;
  a_local._4_4_ = u;
  vVar1 = operator-(b,a);
  local_50._8_8_ = vVar1._8_8_;
  local_50._0_8_ = vVar1._0_8_;
  local_40 = operator*(u,&local_50);
  vVar1 = operator+(a,&local_40);
  return vVar1;
}

Assistant:

V4 lerp(const V1 u, const V4& a, const V4& b) {return a + u * (b - a);}